

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

CaseStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CaseStatementSyntax,slang::syntax::CaseStatementSyntax_const&>
          (BumpAllocator *this,CaseStatementSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  CaseStatementSyntax *pCVar8;
  long lVar9;
  Token *pTVar10;
  Token *pTVar11;
  byte bVar12;
  
  bVar12 = 0;
  pCVar8 = (CaseStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CaseStatementSyntax *)this->endPtr < pCVar8 + 1) {
    pCVar8 = (CaseStatementSyntax *)allocateSlow(this,0xf8,8);
  }
  else {
    this->head->current = (byte *)(pCVar8 + 1);
  }
  (pCVar8->super_StatementSyntax).super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_StatementSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_StatementSyntax).super_SyntaxNode.parent;
  (pCVar8->super_StatementSyntax).super_SyntaxNode.kind =
       (args->super_StatementSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar8->super_StatementSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pCVar8->super_StatementSyntax).super_SyntaxNode.parent = pSVar1;
  (pCVar8->super_StatementSyntax).label = (args->super_StatementSyntax).label;
  (pCVar8->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)
           &(args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar8->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar8->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar4;
  (pCVar8->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar8->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00c8c940;
  (pCVar8->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_StatementSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar8->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_StatementSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar8->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar8->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00c8c880;
  pTVar10 = &args->uniqueOrPriority;
  pTVar11 = &pCVar8->uniqueOrPriority;
  for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
    uVar5 = pTVar10->field_0x2;
    NVar6.raw = (pTVar10->numFlags).raw;
    uVar7 = pTVar10->rawLen;
    pTVar11->kind = pTVar10->kind;
    pTVar11->field_0x2 = uVar5;
    pTVar11->numFlags = (NumericTokenFlags)NVar6.raw;
    pTVar11->rawLen = uVar7;
    pTVar10 = (Token *)&pTVar10[-(ulong)bVar12].info;
    pTVar11 = (Token *)&pTVar11[-(ulong)bVar12].info;
  }
  (pCVar8->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->items).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->items).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->items).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar8->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->items).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar8->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pCVar8->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar8->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00c8c940;
  (pCVar8->items).super_SyntaxListBase.childCount = (args->items).super_SyntaxListBase.childCount;
  sVar2 = (args->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (pCVar8->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar8->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar8->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c94d88;
  uVar5 = (args->endcase).field_0x2;
  NVar6.raw = (args->endcase).numFlags.raw;
  uVar7 = (args->endcase).rawLen;
  pIVar3 = (args->endcase).info;
  (pCVar8->endcase).kind = (args->endcase).kind;
  (pCVar8->endcase).field_0x2 = uVar5;
  (pCVar8->endcase).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar8->endcase).rawLen = uVar7;
  (pCVar8->endcase).info = pIVar3;
  return pCVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }